

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_queue.h
# Opt level: O3

optional<double> __thiscall
density::
function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
::try_consume_impl(function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                   *this,heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>_>
                         *param_2,ControlBlock *param_3)

{
  ulong uVar1;
  FunctionRuntimeType<(density::function_type_erasure)1,_double_()> *pFVar2;
  void *pvVar3;
  ControlBlock *extraout_RDX;
  ControlBlock *extraout_RDX_00;
  optional<double> oVar4;
  consume_operation local_30;
  ControlBlock *local_20;
  
  local_30.m_control = param_2->m_head;
  do {
    if (local_30.m_control == param_2->m_tail) {
      (this->m_queue).m_head = (ControlBlock *)0x0;
      (this->m_queue).m_tail = (ControlBlock *)0x0;
LAB_00a9529a:
      oVar4._8_8_ = param_3;
      oVar4.m_storage = (type)this;
      return oVar4;
    }
    uVar1 = (local_30.m_control)->m_next;
    if ((uVar1 & 3) == 0) {
      (local_30.m_control)->m_next = uVar1 | 1;
      local_30.m_queue = param_2;
      pFVar2 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>_>
               ::consume_operation::complete_type(&local_30);
      pvVar3 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>_>
               ::consume_operation::unaligned_element_ptr(&local_30);
      local_20 = (ControlBlock *)(*pFVar2->m_align_invoke_destroy)(pvVar3);
      heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>_>
      ::consume_operation::commit_nodestroy(&local_30);
      *(undefined1 *)&(this->m_queue).m_tail = 1;
      (this->m_queue).m_head = local_20;
      param_3 = extraout_RDX;
      if (local_30.m_control != (ControlBlock *)0x0) {
        heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>_>
        ::cancel_consume_impl(local_30.m_queue,local_30.m_control);
        param_3 = extraout_RDX_00;
      }
      goto LAB_00a9529a;
    }
    local_30.m_control = (ControlBlock *)(uVar1 & 0xfffffffffffffff8);
    param_3 = local_30.m_control;
  } while( true );
}

Assistant:

optional<RET_VAL> try_consume_impl(std::false_type, PARAMS... i_params)
        {
            if (auto cons = m_queue.try_start_consume())
            {
                auto && result = cons.complete_type().align_invoke_destroy(
                  cons.unaligned_element_ptr(), std::forward<PARAMS>(i_params)...);
                cons.commit_nodestroy();
                return optional<RET_VAL>(std::move(result));
            }
            else
            {
                return optional<RET_VAL>();
            }
        }